

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogAppInterfaceStd.h
# Opt level: O0

void nowtech::log::AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>::error(Exception aError)

{
  char *pcVar1;
  byte in_DIL;
  error_code local_18;
  byte local_1;
  
  local_1 = in_DIL;
  pcVar1 = (char *)__cxa_allocate_exception(0x20);
  std::error_code::error_code<std::io_errc,void>(&local_18,0);
  std::ios_base::failure[abi:cxx11]::failure(pcVar1,(error_code *)(csErrorMessages + local_1));
  __cxa_throw(pcVar1,&std::ios_base::failure[abi:cxx11]::typeinfo,
              std::ios_base::failure[abi:cxx11]::~failure);
}

Assistant:

static void error(Exception const aError) {
    throw std::ios_base::failure(csErrorMessages[static_cast<size_t>(aError)]);
  }